

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::SSBOLayoutCase::compareTypes
          (SSBOLayoutCase *this,BufferLayout *refLayout,BufferLayout *cmpLayout)

{
  pointer pBVar1;
  ostringstream *poVar2;
  int iVar3;
  pointer pBVar4;
  uint uVar5;
  ostream *poVar6;
  char *pcVar7;
  MessageBuilder *pMVar8;
  ulong uVar9;
  int *piVar10;
  pointer pBVar11;
  bool bVar12;
  allocator<char> local_38d;
  int local_38c;
  TestLog *local_388;
  int local_380;
  int local_37c;
  BufferLayout *local_378;
  SSBOLayoutCase *local_370;
  ulong local_368;
  ulong local_360;
  BufferBlock *local_358;
  vector<int,_std::allocator<int>_> *local_350;
  char *local_348 [4];
  undefined1 local_328 [384];
  ostringstream instanceName;
  
  local_388 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  uVar9 = (ulong)((long)(this->m_interface).m_bufferBlocks.
                        super__Vector_base<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_interface).m_bufferBlocks.
                       super__Vector_base<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  local_360 = 0;
  local_368 = uVar9 & 0xffffffff;
  if ((int)uVar9 < 1) {
    local_368 = local_360;
  }
  bVar12 = true;
  local_378 = cmpLayout;
  local_370 = this;
  do {
    if (local_360 == local_368) {
      return bVar12;
    }
    local_358 = (local_370->m_interface).m_bufferBlocks.
                super__Vector_base<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_start[local_360];
    local_380 = local_358->m_arraySize;
    local_38c = 0;
    local_37c = local_380;
    if (local_380 < 1) {
      local_37c = 1;
    }
    for (; local_38c != local_37c; local_38c = local_38c + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&instanceName);
      std::operator<<((ostream *)&instanceName,(local_358->m_blockName)._M_dataplus._M_p);
      if (0 < local_380) {
        poVar6 = std::operator<<(&instanceName.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "[");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_38c);
        std::operator<<(poVar6,"]");
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_328,local_348[0],&local_38d);
      uVar5 = bb::BufferLayout::getBlockIndex(cmpLayout,(string *)local_328);
      std::__cxx11::string::~string((string *)local_328);
      std::__cxx11::string::~string((string *)local_348);
      if (-1 < (int)uVar5) {
        local_350 = &(cmpLayout->blocks).
                     super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5].activeVarIndices;
        for (piVar10 = *(int **)&(local_350->super__Vector_base<int,_std::allocator<int>_>)._M_impl;
            cmpLayout = local_378,
            piVar10 !=
            *(pointer *)
             ((long)&(local_350->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8);
            piVar10 = piVar10 + 1) {
          iVar3 = *piVar10;
          pBVar11 = (local_378->bufferVars).
                    super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_328,pBVar11[iVar3].name._M_dataplus._M_p,
                     (allocator<char> *)local_348);
          pBVar11 = pBVar11 + iVar3;
          uVar5 = bb::BufferLayout::getVariableIndex(refLayout,(string *)local_328);
          std::__cxx11::string::~string((string *)local_328);
          if ((int)uVar5 < 0) {
            local_328._0_8_ = local_388;
            poVar2 = (ostringstream *)(local_328 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::operator<<((ostream *)poVar2,"Error: Buffer variable \'");
            std::operator<<((ostream *)poVar2,(string *)pBVar11);
            std::operator<<((ostream *)poVar2,"\' not found in reference layout");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_013c161d:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_328 + 8));
            bVar12 = false;
          }
          else {
            pBVar4 = (refLayout->bufferVars).
                     super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pBVar1 = pBVar4 + uVar5;
            if (pBVar4[uVar5].type != pBVar11->type) {
              local_328._0_8_ = local_388;
              poVar2 = (ostringstream *)(local_328 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar2);
              std::operator<<((ostream *)poVar2,"Error: Buffer variable type mismatch in \'");
              std::operator<<((ostream *)poVar2,(string *)pBVar1);
              std::operator<<((ostream *)poVar2,"\':\n");
              std::operator<<((ostream *)poVar2,"  expected: ");
              pcVar7 = glu::getDataTypeName(pBVar1->type);
              std::operator<<((ostream *)poVar2,pcVar7);
              std::operator<<((ostream *)poVar2,"\n");
              std::operator<<((ostream *)poVar2,"  got: ");
              pcVar7 = glu::getDataTypeName(pBVar11->type);
              std::operator<<((ostream *)poVar2,pcVar7);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar2);
              bVar12 = false;
            }
            if (pBVar1->arraySize < pBVar11->arraySize) {
              local_328._0_8_ = local_388;
              poVar2 = (ostringstream *)(local_328 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar2);
              std::operator<<((ostream *)poVar2,"Error: Invalid array size in \'");
              std::operator<<((ostream *)poVar2,(string *)pBVar1);
              std::operator<<((ostream *)poVar2,"\': expected <= ");
              pMVar8 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)local_328,&pBVar1->arraySize);
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar2);
              bVar12 = false;
            }
            if (pBVar1->topLevelArraySize < pBVar11->topLevelArraySize) {
              local_328._0_8_ = local_388;
              poVar2 = (ostringstream *)(local_328 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar2);
              std::operator<<((ostream *)poVar2,"Error: Invalid top-level array size in \'");
              std::operator<<((ostream *)poVar2,(string *)pBVar1);
              std::operator<<((ostream *)poVar2,"\': expected <= ");
              pMVar8 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)local_328,&pBVar1->topLevelArraySize);
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_013c161d;
            }
          }
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&instanceName);
    }
    local_360 = local_360 + 1;
  } while( true );
}

Assistant:

bool SSBOLayoutCase::compareTypes (const BufferLayout& refLayout, const BufferLayout& cmpLayout) const
{
	TestLog&	log			= m_testCtx.getLog();
	bool		isOk		= true;
	int			numBlocks	= m_interface.getNumBlocks();

	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const BufferBlock&		block			= m_interface.getBlock(blockNdx);
		bool					isArray			= block.isArray();
		int						numInstances	= isArray ? block.getArraySize() : 1;

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			std::ostringstream instanceName;

			instanceName << block.getBlockName();
			if (isArray)
				instanceName << "[" << instanceNdx << "]";

			int cmpBlockNdx = cmpLayout.getBlockIndex(instanceName.str().c_str());

			if (cmpBlockNdx < 0)
				continue;

			const BlockLayoutEntry& cmpBlockLayout = cmpLayout.blocks[cmpBlockNdx];

			for (vector<int>::const_iterator ndxIter = cmpBlockLayout.activeVarIndices.begin(); ndxIter != cmpBlockLayout.activeVarIndices.end(); ndxIter++)
			{
				const BufferVarLayoutEntry&	cmpEntry	= cmpLayout.bufferVars[*ndxIter];
				int							refEntryNdx	= refLayout.getVariableIndex(cmpEntry.name.c_str());

				if (refEntryNdx < 0)
				{
					log << TestLog::Message << "Error: Buffer variable '" << cmpEntry.name << "' not found in reference layout" << TestLog::EndMessage;
					isOk = false;
					continue;
				}

				const BufferVarLayoutEntry&	refEntry	= refLayout.bufferVars[refEntryNdx];

				if (refEntry.type != cmpEntry.type)
				{
					log << TestLog::Message << "Error: Buffer variable type mismatch in '" << refEntry.name << "':\n"
						<< "  expected: " << glu::getDataTypeName(refEntry.type) << "\n"
						<< "  got: " << glu::getDataTypeName(cmpEntry.type)
						<< TestLog::EndMessage;
					isOk = false;
				}

				if (refEntry.arraySize < cmpEntry.arraySize)
				{
					log << TestLog::Message << "Error: Invalid array size in '" << refEntry.name << "': expected <= " << refEntry.arraySize << TestLog::EndMessage;
					isOk = false;
				}

				if (refEntry.topLevelArraySize < cmpEntry.topLevelArraySize)
				{
					log << TestLog::Message << "Error: Invalid top-level array size in '" << refEntry.name << "': expected <= " << refEntry.topLevelArraySize << TestLog::EndMessage;
					isOk = false;
				}
			}
		}
	}

	return isOk;
}